

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_interpolate.cpp
# Opt level: O1

DInterpolation * __thiscall sector_t::SetInterpolation(sector_t *this,int position,bool attach)

{
  int *piVar1;
  anon_union_8_2_947301c2_for_TObjPtr<DInterpolation>_1 aVar2;
  long lVar3;
  sector_t *psVar4;
  
  if (this->interpolations[position].field_0.p != (DInterpolation *)0x0) {
    if ((*(byte *)((long)this->interpolations[position].field_0.p + 0x20) & 0x20) != 0) {
      this->interpolations[position].field_0 =
           (anon_union_8_2_947301c2_for_TObjPtr<DInterpolation>_1)0x0;
      goto LAB_0069096c;
    }
    goto LAB_00690aac;
  }
LAB_0069096c:
  switch(position) {
  case 0:
    aVar2.p = (DInterpolation *)
              M_Malloc_Dbg(0x80,
                           "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/./dobject.h"
                           ,0x1f7);
    DSectorPlaneInterpolation::DSectorPlaneInterpolation
              ((DSectorPlaneInterpolation *)aVar2.p,this,true,attach);
    break;
  case 1:
    aVar2.p = (DInterpolation *)
              M_Malloc_Dbg(0x80,
                           "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/./dobject.h"
                           ,0x1f7);
    DSectorPlaneInterpolation::DSectorPlaneInterpolation
              ((DSectorPlaneInterpolation *)aVar2.p,this,false,attach);
    break;
  case 2:
    aVar2.p = (DInterpolation *)
              M_Malloc_Dbg(0x70,
                           "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/./dobject.h"
                           ,0x1f7);
    DObject::DObject(aVar2.o);
    ((aVar2.p)->Next).field_0.p = (DInterpolation *)0x0;
    ((aVar2.p)->Prev).field_0.p = (DInterpolation *)0x0;
    (aVar2.p)->refcount = 0;
    (((DInterpolation *)&(aVar2.p)->super_DObject)->super_DObject)._vptr_DObject =
         (_func_int **)&PTR_StaticType_008693f0;
    aVar2.p[1].super_DObject._vptr_DObject = (_func_int **)this;
    *(bool *)&aVar2.p[1].Next.field_0 = true;
    psVar4 = (sector_t *)(this->planes + 1);
    lVar3 = 0x60;
    goto LAB_00690a54;
  case 3:
    aVar2.p = (DInterpolation *)
              M_Malloc_Dbg(0x70,
                           "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/./dobject.h"
                           ,0x1f7);
    DObject::DObject(aVar2.o);
    ((aVar2.p)->Next).field_0.p = (DInterpolation *)0x0;
    ((aVar2.p)->Prev).field_0.p = (DInterpolation *)0x0;
    (aVar2.p)->refcount = 0;
    (((DInterpolation *)&(aVar2.p)->super_DObject)->super_DObject)._vptr_DObject =
         (_func_int **)&PTR_StaticType_008693f0;
    aVar2.p[1].super_DObject._vptr_DObject = (_func_int **)this;
    *(bool *)&aVar2.p[1].Next.field_0 = false;
    lVar3 = 8;
    psVar4 = this;
LAB_00690a54:
    aVar2.p[1].super_DObject.Class = (PClass *)psVar4->planes[0].xform.xOffs;
    aVar2.p[1].super_DObject.ObjNext = *(DObject **)((long)&this->planes[0].xform.xOffs + lVar3);
    FInterpolator::AddInterpolation(&interpolator,aVar2.p);
    break;
  default:
    goto switchD_00690985_default;
  }
  this->interpolations[position].field_0 = aVar2;
LAB_00690aac:
  piVar1 = (int *)((long)this->interpolations[position].field_0.p + 0x38);
  *piVar1 = *piVar1 + 1;
  aVar2 = (anon_union_8_2_947301c2_for_TObjPtr<DInterpolation>_1)
          this->interpolations[position].field_0.o;
  if ((aVar2 != (DInterpolation *)0x0) && ((((aVar2.p)->super_DObject).ObjectFlags & 0x20) != 0)) {
    this->interpolations[position].field_0 =
         (anon_union_8_2_947301c2_for_TObjPtr<DInterpolation>_1)0x0;
    aVar2.p = (DInterpolation *)0x0;
  }
  if (((aVar2.p != (DInterpolation *)0x0) && (GC::State == 1)) &&
     ((((aVar2.p)->super_DObject).ObjectFlags & 3) != 0)) {
    GC::Barrier((DObject *)0x0,aVar2.o);
  }
  aVar2 = (anon_union_8_2_947301c2_for_TObjPtr<DInterpolation>_1)
          this->interpolations[position].field_0.p;
  if ((aVar2 != (DInterpolation *)0x0) && ((((aVar2.p)->super_DObject).ObjectFlags & 0x20) != 0)) {
    this->interpolations[position].field_0 =
         (anon_union_8_2_947301c2_for_TObjPtr<DInterpolation>_1)0x0;
switchD_00690985_default:
    aVar2.p = (DInterpolation *)0x0;
  }
  return aVar2.p;
}

Assistant:

DInterpolation *sector_t::SetInterpolation(int position, bool attach)
{
	if (interpolations[position] == NULL)
	{
		DInterpolation *interp;
		switch (position)
		{
		case sector_t::CeilingMove:
			interp = new DSectorPlaneInterpolation(this, true, attach);
			break;

		case sector_t::FloorMove:
			interp = new DSectorPlaneInterpolation(this, false, attach);
			break;

		case sector_t::CeilingScroll:
			interp = new DSectorScrollInterpolation(this, true);
			break;

		case sector_t::FloorScroll:
			interp = new DSectorScrollInterpolation(this, false);
			break;

		default:
			return NULL;
		}
		interpolations[position] = interp;
	}
	interpolations[position]->AddRef();
	GC::WriteBarrier(interpolations[position]);
	return interpolations[position];
}